

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataStream.cpp
# Opt level: O2

void __thiscall DIS::DataStream::DoFlip(DataStream *this,char *buf,size_t bufsize)

{
  char cVar1;
  char *pcVar2;
  
  if ((1 < bufsize) && (this->_machine_endian != this->_stream_endian)) {
    pcVar2 = buf + bufsize;
    for (; pcVar2 = pcVar2 + -1, buf < pcVar2; buf = buf + 1) {
      cVar1 = *buf;
      *buf = *pcVar2;
      *pcVar2 = cVar1;
    }
  }
  return;
}

Assistant:

void DataStream::DoFlip(char* buf, size_t bufsize)
{
   if( _machine_endian == _stream_endian || bufsize<2 )
   {
      return;
   }

   // flip it, this fills back to front
   char* start = &buf[0];
   char* end = &buf[bufsize-1];
   while( start < end )
   {
      /// save the beginning of the buffer
      char temp = *start;

      /// overwrite the beginning of the buffer
      *start = *end;
      *end = temp;

      ++start;
      --end;
   }
}